

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O0

RPCHelpMan * wallet::listreceivedbyaddress(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffe5d8;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffe5e0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe610;
  UniValue *in_stack_ffffffffffffe618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe620;
  undefined7 in_stack_ffffffffffffe628;
  undefined1 in_stack_ffffffffffffe62f;
  string *in_stack_ffffffffffffe630;
  undefined7 in_stack_ffffffffffffe638;
  undefined1 in_stack_ffffffffffffe63f;
  undefined4 in_stack_ffffffffffffe640;
  Type in_stack_ffffffffffffe644;
  string *in_stack_ffffffffffffe648;
  undefined4 in_stack_ffffffffffffe650;
  Type in_stack_ffffffffffffe654;
  undefined4 in_stack_ffffffffffffe658;
  Type in_stack_ffffffffffffe65c;
  RPCResult *in_stack_ffffffffffffe660;
  undefined1 *local_1960;
  undefined1 *local_1948;
  undefined1 *local_1930;
  undefined1 *local_1918;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  RPCMethodImpl *fun;
  undefined1 local_1698 [37];
  allocator<char> local_1673;
  allocator<char> local_1672;
  allocator<char> local_1671;
  allocator<char> local_1670;
  undefined1 local_166f;
  undefined1 local_166e;
  undefined1 local_166d;
  undefined1 local_166c [2];
  undefined1 local_166a [32];
  allocator<char> local_164a;
  allocator<char> local_1649 [31];
  allocator<char> local_162a;
  allocator<char> local_1629 [31];
  allocator<char> local_160a;
  allocator<char> local_1609 [9];
  undefined8 uStack_1600;
  _Alloc_hider local_15f8;
  allocator<char> local_15ea;
  allocator<char> local_15e9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_15e8;
  undefined1 local_15d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_15c0;
  allocator<char> local_15aa;
  allocator<char> local_15a9;
  pointer local_15a8;
  pointer pbStack_15a0;
  undefined8 local_1598;
  allocator<char> local_1582;
  allocator<char> local_1581 [31];
  allocator<char> local_1562;
  allocator<char> local_1561 [31];
  allocator<char> local_1542;
  allocator<char> local_1541 [33];
  undefined1 local_1520 [3];
  allocator<char> local_151d [5];
  allocator<char> local_1518;
  allocator<char> local_1517;
  allocator<char> local_1516;
  allocator<char> local_1515;
  allocator<char> local_1514 [2];
  allocator<char> local_1512;
  allocator<char> local_1511;
  undefined4 local_1510;
  allocator<char> local_1509 [31];
  allocator<char> local_14ea;
  allocator<char> local_14e9 [737];
  undefined1 local_1208 [136];
  undefined1 local_1180 [384];
  undefined8 local_1000;
  undefined1 local_fe0 [816];
  undefined1 local_cb0 [64];
  undefined1 local_c70 [136];
  undefined1 local_be8 [200];
  undefined1 local_b20;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined1 local_ae0;
  undefined1 local_adf;
  undefined1 local_9e0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined1 local_9a0;
  undefined1 local_99f;
  undefined1 local_8f8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined1 local_8b8;
  undefined1 local_8b7;
  undefined1 local_7f0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined1 local_7b0;
  undefined1 local_7af;
  undefined1 local_6b0;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined1 local_670;
  undefined1 local_66f;
  undefined1 local_570 [1320];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_1510 = 1;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffe618,(int *)in_stack_ffffffffffffe610);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe5e8,in_stack_ffffffffffffe5e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_6b0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe5f0);
  local_688 = 0;
  uStack_680 = 0;
  local_678 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe5d8);
  local_670 = 0;
  local_66f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
                 in_stack_ffffffffffffe630,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_1514[1] = (allocator<char>)0x0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe618,(bool *)in_stack_ffffffffffffe610);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe5e8,in_stack_ffffffffffffe5e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_7f0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe5f0);
  local_7c8 = 0;
  uStack_7c0 = 0;
  local_7b8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe5d8);
  local_7b0 = 0;
  local_7af = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
                 in_stack_ffffffffffffe630,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe5e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_8f8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe5f0);
  local_8d0 = 0;
  uStack_8c8 = 0;
  local_8c0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe5d8);
  local_8b8 = 0;
  local_8b7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
                 in_stack_ffffffffffffe630,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_151d[1] = (allocator<char>)0x1;
  local_151d[2] = (allocator<char>)0x0;
  local_151d[3] = (allocator<char>)0x0;
  local_151d[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe5e8,&in_stack_ffffffffffffe5e0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_9e0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe5f0);
  local_9b8 = 0;
  uStack_9b0 = 0;
  local_9a8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe5d8);
  local_9a0 = 0;
  local_99f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
                 in_stack_ffffffffffffe630,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_1520[1] = '\0';
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe618,(bool *)in_stack_ffffffffffffe610);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe5e8,in_stack_ffffffffffffe5e0);
  fun = (RPCMethodImpl *)local_1520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_b20 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe5f0);
  local_af8 = 0;
  uStack_af0 = 0;
  local_ae8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe5d8);
  local_ae0 = 0;
  local_adf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 in_stack_ffffffffffffe648,in_stack_ffffffffffffe644,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
                 in_stack_ffffffffffffe630,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffe5d8);
  __l._M_len._0_7_ = in_stack_ffffffffffffe628;
  __l._M_array = (iterator)in_stack_ffffffffffffe620;
  __l._M_len._7_1_ = in_stack_ffffffffffffe62f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe618,__l,
             (allocator_type *)in_stack_ffffffffffffe610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_15a8 = (pointer)0x0;
  pbStack_15a0 = (pointer)0x0;
  local_1598._0_1_ = false;
  local_1598._1_1_ = false;
  local_1598._2_6_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5d8);
  this = (allocator<RPCResult> *)((ulong)in_stack_ffffffffffffe5d8 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658),
             in_stack_ffffffffffffe654,in_stack_ffffffffffffe648,
             SUB41(in_stack_ffffffffffffe644 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe630,
             (bool)in_stack_ffffffffffffe62f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_15d8._16_8_ = 0;
  aStack_15c0._M_allocated_capacity = 0;
  aStack_15c0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe660,in_stack_ffffffffffffe65c,
             (string *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
             in_stack_ffffffffffffe648,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe644,in_stack_ffffffffffffe640),
             (bool)in_stack_ffffffffffffe63f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f0,(char *)in_stack_ffffffffffffe5e8);
  local_15e8._M_allocated_capacity = 0;
  local_15e8._8_8_ = 0;
  local_15d8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe660,in_stack_ffffffffffffe65c,
             (string *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
             in_stack_ffffffffffffe648,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe644,in_stack_ffffffffffffe640),
             (bool)in_stack_ffffffffffffe63f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_1609._1_8_ = 0;
  uStack_1600 = 0;
  local_15f8._M_p = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe660,in_stack_ffffffffffffe65c,
             (string *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
             in_stack_ffffffffffffe648,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe644,in_stack_ffffffffffffe640),
             (bool)in_stack_ffffffffffffe63f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_1629._1_8_ = 0;
  local_1629._9_8_ = 0;
  local_1629[0x11] = (allocator<char>)0x0;
  local_1629[0x12] = (allocator<char>)0x0;
  local_1629[0x13] = (allocator<char>)0x0;
  local_1629[0x14] = (allocator<char>)0x0;
  local_1629[0x15] = (allocator<char>)0x0;
  local_1629[0x16] = (allocator<char>)0x0;
  local_1629[0x17] = (allocator<char>)0x0;
  local_1629[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe660,in_stack_ffffffffffffe65c,
             (string *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
             in_stack_ffffffffffffe648,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe644,in_stack_ffffffffffffe640),
             (bool)in_stack_ffffffffffffe63f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  local_166a._2_8_ = (pointer)0x0;
  local_166a._10_8_ = (pointer)0x0;
  local_166a._18_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe660,in_stack_ffffffffffffe65c,
             (string *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
             in_stack_ffffffffffffe648,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe644,in_stack_ffffffffffffe640),
             (bool)in_stack_ffffffffffffe63f);
  std::allocator<RPCResult>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe628;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe620;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe62f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618,__l_00,
             (allocator_type *)in_stack_ffffffffffffe610);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe660,in_stack_ffffffffffffe65c,
             (string *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
             in_stack_ffffffffffffe648,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe644,in_stack_ffffffffffffe640),
             (bool)in_stack_ffffffffffffe63f);
  this_01 = (RPCHelpMan *)local_166a;
  std::allocator<RPCResult>::allocator(this);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe628;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe620;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe62f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618,__l_01,
             (allocator_type *)in_stack_ffffffffffffe610);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe660,in_stack_ffffffffffffe65c,
             (string *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
             in_stack_ffffffffffffe648,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe644,in_stack_ffffffffffffe640),
             (bool)in_stack_ffffffffffffe63f);
  name = (string *)(local_166c + 1);
  std::allocator<RPCResult>::allocator(this);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffe628;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe620;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffe62f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618,__l_02,
             (allocator_type *)in_stack_ffffffffffffe610);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe660,in_stack_ffffffffffffe65c,
             (string *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
             in_stack_ffffffffffffe648,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe644,in_stack_ffffffffffffe640),
             (bool)in_stack_ffffffffffffe63f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
  description = (string *)local_166c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_166d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  HelpExampleCli(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  results = (RPCResults *)&local_166e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  examples = (RPCExamples *)&local_166f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  HelpExampleCli(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  std::operator+(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  HelpExampleCli(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  std::operator+(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  HelpExampleRpc(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  std::operator+(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
             (char *)in_stack_ffffffffffffe620,(allocator<char> *)in_stack_ffffffffffffe618);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe62f,in_stack_ffffffffffffe628),
                 in_stack_ffffffffffffe620);
  std::operator+(in_stack_ffffffffffffe5f0,(char *)in_stack_ffffffffffffe5e8);
  HelpExampleRpc(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  std::operator+(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x185ec89);
  this_00 = (RPCArg *)local_1698;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::listreceivedbyaddress()::__0,void>
            (in_stack_ffffffffffffe5e8,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe5e0);
  RPCHelpMan::RPCHelpMan(this_01,name,description,args,results,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1698 + 0x24));
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1673);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1672);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1671);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1670);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_166f);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_166e);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_166d);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_166c);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5e8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1918 = local_be8;
  do {
    local_1918 = local_1918 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1918 != local_c70);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5e8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1930 = local_cb0;
  do {
    local_1930 = local_1930 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1930 != local_fe0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5e8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1948 = local_1180;
  do {
    local_1948 = local_1948 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1948 != local_1208);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5e8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_164a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1649);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_162a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1629);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5e8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_160a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1609);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5e8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_15ea);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_15e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5e8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_15d8 + 0xf));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5e8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_15aa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_15a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5e8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1582);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1581);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1562);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1561);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1542);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1541);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe5e8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_1960 = local_48;
  do {
    local_1960 = local_1960 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1960 != local_570);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1520);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1520 + 2));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_151d);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1518);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1517);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1516);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1515);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1514);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1512);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1511);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1509);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_14ea);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_14e9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listreceivedbyaddress()
{
    return RPCHelpMan{"listreceivedbyaddress",
                "\nList balances by receiving address.\n",
                {
                    {"minconf", RPCArg::Type::NUM, RPCArg::Default{1}, "The minimum number of confirmations before payments are included."},
                    {"include_empty", RPCArg::Type::BOOL, RPCArg::Default{false}, "Whether to include addresses that haven't received any payments."},
                    {"include_watchonly", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Whether to include watch-only addresses (see 'importaddress')"},
                    {"address_filter", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "If present and non-empty, only return information on this address."},
                    {"include_immature_coinbase", RPCArg::Type::BOOL, RPCArg::Default{false}, "Include immature coinbase transactions."},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::BOOL, "involvesWatchonly", /*optional=*/true, "Only returns true if imported addresses were involved in transaction"},
                            {RPCResult::Type::STR, "address", "The receiving address"},
                            {RPCResult::Type::STR_AMOUNT, "amount", "The total amount in " + CURRENCY_UNIT + " received by the address"},
                            {RPCResult::Type::NUM, "confirmations", "The number of confirmations of the most recent transaction included"},
                            {RPCResult::Type::STR, "label", "The label of the receiving address. The default label is \"\""},
                            {RPCResult::Type::ARR, "txids", "",
                            {
                                {RPCResult::Type::STR_HEX, "txid", "The ids of transactions received with the address"},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listreceivedbyaddress", "")
            + HelpExampleCli("listreceivedbyaddress", "6 true")
            + HelpExampleCli("listreceivedbyaddress", "6 true true \"\" true")
            + HelpExampleRpc("listreceivedbyaddress", "6, true, true")
            + HelpExampleRpc("listreceivedbyaddress", "6, true, true, \"" + EXAMPLE_ADDRESS[0] + "\", true")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    const bool include_immature_coinbase{request.params[4].isNull() ? false : request.params[4].get_bool()};

    LOCK(pwallet->cs_wallet);

    return ListReceived(*pwallet, request.params, false, include_immature_coinbase);
},
    };
}